

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gia_GlaPrepareCexAndMap(Gla_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMap)

{
  Gla_Obj_t *pGVar1;
  sat_solver2 *psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  Abc_Cex_t *pAVar10;
  Gla_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Abs_Par_t *pAVar13;
  long lVar14;
  ulong uVar15;
  int iFrame;
  int iVar16;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(4000);
  p_00->pArray = piVar7;
  pVVar12 = p->vAbs;
  if (pVVar12->nSize < 1) {
    iVar16 = 0;
  }
  else {
    lVar14 = 0;
    do {
      lVar8 = (long)pVVar12->pArray[lVar14];
      if ((lVar8 < 0) || (p->nObjs <= pVVar12->pArray[lVar14])) {
LAB_00564a39:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar5 = *(uint *)&pGVar1[lVar8].field_0x4;
      if ((uVar5 & 0xa4) == 0) {
        __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0xa0,"void Gia_GlaPrepareCexAndMap(Gla_Man_t *, Abc_Cex_t **, Vec_Int_t **)")
        ;
      }
      if (0x1ff < uVar5) {
        uVar15 = 0;
        do {
          iVar16 = pGVar1[lVar8].Fanins[uVar15];
          if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_00564a39;
          if (iVar16 == 0) {
            pGVar11 = (Gla_Obj_t *)0x0;
          }
          else {
            pGVar11 = p->pObjs + iVar16;
          }
          if ((pGVar11->field_0x4 & 1) == 0) {
            Vec_IntPush(p_00,pGVar11->iGiaObj);
            uVar5 = *(uint *)&pGVar1[lVar8].field_0x4;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar5 >> 9);
        pVVar12 = p->vAbs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar12->nSize);
    iVar16 = p_00->nSize;
    uVar15 = (ulong)iVar16;
    if (1 < (long)uVar15) {
      piVar7 = p_00->pArray;
      qsort(piVar7,uVar15,4,Vec_IntSortCompare1);
      iVar16 = 1;
      uVar9 = 1;
      do {
        if (piVar7[uVar9] != piVar7[uVar9 - 1]) {
          lVar14 = (long)iVar16;
          iVar16 = iVar16 + 1;
          piVar7[lVar14] = piVar7[uVar9];
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar15);
      p_00->nSize = iVar16;
    }
  }
  pAVar10 = Abc_CexAlloc(0,iVar16,p->pPars->iFrame + 1);
  pAVar13 = p->pPars;
  iVar6 = pAVar13->iFrame;
  pAVar10->iFrame = iVar6;
  if (-1 < iVar6) {
    iVar6 = 0;
    iFrame = 0;
    do {
      if (0 < iVar16) {
        piVar7 = p_00->pArray;
        lVar14 = 0;
        do {
          lVar8 = (long)piVar7[lVar14];
          if ((lVar8 < 0) || (p->pGia->nObjs <= piVar7[lVar14])) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
          iVar4 = Gla_ManCheckVar(p,p->pObj2Obj[lVar8],iFrame);
          if (iVar4 != 0) {
            psVar2 = p->pSat;
            uVar5 = Gla_ManGetVar(p,p->pObj2Obj[lVar8],iFrame);
            if (((int)uVar5 < 0) || (psVar2->size <= (int)uVar5)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                            ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
            }
            if (psVar2->model[uVar5] == 1) {
              iVar4 = iVar6 + (int)lVar14;
              (&pAVar10[1].iPo)[iVar4 >> 5] =
                   (&pAVar10[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar16);
        pAVar13 = p->pPars;
      }
      iVar6 = iVar6 + iVar16;
      bVar3 = iFrame < pAVar13->iFrame;
      iFrame = iFrame + 1;
    } while (bVar3);
  }
  *pvMap = p_00;
  *ppCex = pAVar10;
  return;
}

Assistant:

void Gia_GlaPrepareCexAndMap( Gla_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMap )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gla_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pGiaObj;
    int f, i, k;
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( vMap, pFanin->iGiaObj );
    }
    Vec_IntUniqify( vMap );
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pGiaObj, k )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pGiaObj), f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMap = vMap;
    *ppCex = pCex;
}